

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mocks.c
# Opt level: O0

void test_times_called(Constraint *constraint,char *function,CgreenValue actual,char *test_file,
                      int test_line,TestReporter *reporter)

{
  code *pcVar1;
  byte bVar2;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  long in_R8;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  char parameter_name_actual_string [255];
  char *message;
  char local_138 [264];
  void *local_30;
  long local_28;
  undefined4 local_1c;
  undefined8 local_18;
  long local_8;
  
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_8 = in_RDI;
  snprintf(local_138,0xfe,"%s",in_RSI);
  local_30 = (void *)(**(code **)(local_8 + 0x28))(local_8,local_138,in_stack_00000010);
  pcVar1 = *(code **)(local_28 + 0x38);
  bVar2 = (**(code **)(local_8 + 0x18))(local_8);
  (*pcVar1)(local_28,local_18,local_1c,bVar2 & 1,local_30,pcVar1,in_stack_00000008,in_stack_00000010
            ,in_stack_00000018);
  free(local_30);
  return;
}

Assistant:

void test_times_called(Constraint *constraint, const char *function, CgreenValue actual,
               const char *test_file, int test_line, TestReporter *reporter) {
    char *message;
    char parameter_name_actual_string[255];

    snprintf(parameter_name_actual_string, sizeof(parameter_name_actual_string) - 1, "%s", function);
    message = constraint->failure_message(constraint, parameter_name_actual_string, actual.value.integer_value);

    (*reporter->assert_true)(
            reporter,
            test_file,
            test_line,
            (*constraint->compare)(constraint, actual),
            message);

    free(message);
}